

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.cpp
# Opt level: O2

void __thiscall
Array_MultiLineWithMultipleItems_Test::TestBody(Array_MultiLineWithMultipleItems_Test *this)

{
  long lVar1;
  char *message;
  initializer_list<sax_event_t> __l;
  allocator_type local_5ac;
  allocator local_5ab;
  allocator local_5aa;
  allocator local_5a9;
  string local_5a8;
  string local_588;
  events_aggregator_t handler;
  vector<sax_event_t,_std::allocator<sax_event_t>_> expected_events;
  string local_538;
  AssertionResult gtest_ar;
  sax_event_t local_4c0;
  undefined4 local_468;
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 local_450;
  undefined1 *local_448;
  undefined8 local_440;
  undefined1 local_438 [40];
  undefined4 local_410;
  undefined8 local_408;
  undefined8 uStack_400;
  undefined8 local_3f8;
  undefined1 *local_3f0;
  undefined8 local_3e8;
  undefined1 local_3e0 [24];
  undefined8 local_3c8;
  sax_event_t local_3b8;
  undefined4 local_360;
  undefined8 local_358;
  undefined8 uStack_350;
  undefined8 local_348;
  undefined1 *local_340;
  undefined8 local_338;
  undefined1 local_330 [24];
  undefined8 local_318;
  undefined4 local_308;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 local_2f0;
  undefined1 *local_2e8;
  undefined8 local_2e0;
  undefined1 local_2d8 [24];
  undefined8 local_2c0;
  sax_event_t local_2b0;
  undefined4 local_258;
  undefined8 local_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined1 *local_238;
  undefined8 local_230;
  undefined1 local_228 [24];
  undefined8 local_210;
  undefined4 local_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined1 *local_1e0;
  undefined8 local_1d8;
  undefined1 local_1d0 [40];
  istringstream input;
  
  std::__cxx11::string::string
            ((string *)&gtest_ar,
             "key = [ \r\n 1\t \n,#comment\n \t  2 ,\r\n 3  \t # one more comment\n]",
             (allocator *)&local_5a8);
  std::__cxx11::istringstream::istringstream((istringstream *)&input,(string *)&gtest_ar,_S_in);
  std::__cxx11::string::~string((string *)&gtest_ar);
  handler.events.super__Vector_base<sax_event_t,_std::allocator<sax_event_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  handler.events.super__Vector_base<sax_event_t,_std::allocator<sax_event_t>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  handler.events.super__Vector_base<sax_event_t,_std::allocator<sax_event_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  loltoml::v_0_1_1::parse<events_aggregator_t>((istream *)&input,&handler);
  gtest_ar.success_ = true;
  gtest_ar._1_3_ = 0;
  gtest_ar.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  std::__cxx11::string::string((string *)&local_5a8,"key",&local_5a9);
  sax_event_t::sax_event_t(&local_4c0,key,&local_5a8);
  local_448 = local_438;
  local_468 = 7;
  local_460 = 0;
  uStack_458 = 0;
  local_450 = 0;
  local_440 = 0;
  local_438[0] = 0;
  local_410 = 0xe;
  local_408 = 0;
  uStack_400 = 0;
  local_3f8 = 0;
  local_3f0 = local_3e0;
  local_3e8 = 0;
  local_3e0[0] = 0;
  local_3c8 = 1;
  std::__cxx11::string::string((string *)&local_588,"comment",&local_5aa);
  sax_event_t::sax_event_t(&local_3b8,comment,&local_588);
  local_340 = local_330;
  local_360 = 0xe;
  local_358 = 0;
  uStack_350 = 0;
  local_348 = 0;
  local_338 = 0;
  local_330[0] = 0;
  local_318 = 2;
  local_300 = 0;
  uStack_2f8 = 0;
  local_2f0 = 0;
  local_2e8 = local_2d8;
  local_2e0 = 0;
  local_2d8[0] = 0;
  local_2c0 = 3;
  local_308 = local_360;
  std::__cxx11::string::string((string *)&local_538," one more comment",&local_5ab);
  sax_event_t::sax_event_t(&local_2b0,comment,&local_538);
  local_238 = local_228;
  local_258 = 8;
  local_250 = 0;
  uStack_248 = 0;
  local_240 = 0;
  local_230 = 0;
  local_228[0] = 0;
  local_210 = 3;
  local_200 = 2;
  local_1e8 = 0;
  local_1f8 = 0;
  uStack_1f0 = 0;
  local_1e0 = local_1d0;
  local_1d8 = 0;
  local_1d0[0] = 0;
  __l._M_len = 10;
  __l._M_array = (iterator)&gtest_ar;
  std::vector<sax_event_t,_std::allocator<sax_event_t>_>::vector(&expected_events,__l,&local_5ac);
  lVar1 = 0x318;
  do {
    sax_event_t::~sax_event_t((sax_event_t *)(&gtest_ar.success_ + lVar1));
    lVar1 = lVar1 + -0x58;
  } while (lVar1 != -0x58);
  std::__cxx11::string::~string((string *)&local_538);
  std::__cxx11::string::~string((string *)&local_588);
  std::__cxx11::string::~string((string *)&local_5a8);
  testing::internal::
  CmpHelperEQ<std::vector<sax_event_t,std::allocator<sax_event_t>>,std::vector<sax_event_t,std::allocator<sax_event_t>>>
            ((internal *)&gtest_ar,"expected_events","handler.events",&expected_events,
             &handler.events);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_5a8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_588,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/andrusha97[P]loltoml/tests/array.cpp"
               ,0x99,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_588,(Message *)&local_5a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_588);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_5a8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::vector<sax_event_t,_std::allocator<sax_event_t>_>::~vector(&expected_events);
  std::vector<sax_event_t,_std::allocator<sax_event_t>_>::~vector(&handler.events);
  std::__cxx11::istringstream::~istringstream((istringstream *)&input);
  return;
}

Assistant:

TEST(Array, MultiLineWithMultipleItems) {
    std::istringstream input("key = [ \r\n 1\t \n,#comment\n \t  2 ,\r\n 3  \t # one more comment\n]");
    events_aggregator_t handler;

    loltoml::parse(input, handler);

    std::vector<sax_event_t> expected_events = {
        {sax_event_t::start_document},
        {sax_event_t::key, "key"},
        {sax_event_t::start_array},
        {sax_event_t::integer, 1},
        {sax_event_t::comment, "comment"},
        {sax_event_t::integer, 2},
        {sax_event_t::integer, 3},
        {sax_event_t::comment, " one more comment"},
        {sax_event_t::finish_array, 3},
        {sax_event_t::finish_document}
    };

    EXPECT_EQ(expected_events, handler.events);
}